

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_set_rdev(archive_entry *entry,dev_t m)

{
  dev_t m_local;
  archive_entry *entry_local;
  
  entry->stat_valid = L'\0';
  (entry->ae_stat).aest_rdev = m;
  (entry->ae_stat).aest_rdev_is_broken_down = L'\0';
  (entry->ae_stat).aest_rdevmajor = 0;
  (entry->ae_stat).aest_rdevminor = 0;
  entry->ae_set = entry->ae_set | 0x2000;
  return;
}

Assistant:

void
archive_entry_set_rdev(struct archive_entry *entry, __LA_DEV_T m)
{
	entry->stat_valid = 0;
	entry->ae_stat.aest_rdev = m;
	entry->ae_stat.aest_rdev_is_broken_down = 0;
	entry->ae_stat.aest_rdevmajor = 0;
	entry->ae_stat.aest_rdevminor = 0;
	entry->ae_set |= AE_SET_RDEV;
}